

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx::forwardDilation_x86
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t _elemsize;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  Layer *pLVar11;
  int iVar12;
  int iVar13;
  int *piVar14;
  int j;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Allocator *pAVar19;
  ulong uVar20;
  long lVar21;
  int _w;
  int iVar22;
  int _w_00;
  ulong uVar23;
  undefined4 *puVar24;
  int iVar25;
  Allocator *pAVar26;
  ulong uVar27;
  undefined4 *puVar28;
  int j_1;
  long lVar29;
  int _w_01;
  ulong uVar30;
  undefined4 *puVar31;
  long local_1c8;
  long local_1c0;
  long local_180;
  long local_160;
  Mat local_118;
  Mat local_c8;
  Option opt_g;
  
  iVar2 = bottom_blob->w;
  iVar3 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  iVar4 = (this->super_Convolution).kernel_w;
  iVar5 = (this->super_Convolution).stride_w;
  uVar6 = (this->super_Convolution).dilation_w;
  iVar22 = (iVar4 + -1) * uVar6 + 1;
  iVar12 = (iVar2 - iVar22) / iVar5;
  _w = iVar12 + 1;
  Mat::create(top_blob,_w,(iVar3 - iVar22) / iVar5 + 1,(this->super_Convolution).num_output,
              _elemsize,opt->blob_allocator);
  iVar22 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_c8.cstep = 0;
    local_118.data = (Allocator *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
    local_118.elempack = 0;
    local_118.cstep = 0;
    uVar18 = 0;
    if (0 < (int)uVar6) {
      uVar18 = (ulong)uVar6;
    }
    local_1c0 = 0;
    local_1c8 = 0;
    local_118.elemsize = local_c8.elemsize;
    local_118.allocator = (Allocator *)local_118.data;
    local_118.dims = (int)local_118.refcount;
    local_118.w = local_118.refcount._4_4_;
    local_118._48_8_ = local_c8.elemsize;
    local_118.c = local_118.elempack;
    local_c8.data = local_118.data;
    local_c8.refcount._0_4_ = (int)local_118.refcount;
    local_c8.refcount._4_4_ = local_118.refcount._4_4_;
    local_c8.elempack = local_118.elempack;
    local_c8.allocator = (Allocator *)local_118.data;
    local_c8.dims = (int)local_118.refcount;
    local_c8.w = local_118.refcount._4_4_;
    local_c8._48_8_ = local_c8.elemsize;
    local_c8.c = local_118.elempack;
    for (uVar17 = 0; uVar17 != uVar18; uVar17 = uVar17 + 1) {
      local_180 = local_1c0;
      local_160 = local_1c8;
      for (uVar16 = 0; uVar16 != uVar6; uVar16 = uVar16 + 1) {
        uVar30 = (long)(int)((uVar6 + iVar2 + -1) - (int)uVar16) / (long)(int)uVar6;
        uVar20 = (long)(int)((uVar6 + iVar3 + -1) - (int)uVar17) / (long)(int)uVar6;
        _w_01 = (int)uVar30;
        iVar22 = (_w_01 - iVar4) / iVar5;
        iVar25 = (int)uVar20;
        iVar13 = (iVar25 - iVar4) / iVar5;
        Mat::create(&local_c8,_w_01,iVar25,bottom_blob->c,_elemsize,opt->workspace_allocator);
        if (((Allocator *)local_c8.data == (Allocator *)0x0) ||
           ((long)local_c8.c * local_c8.cstep == 0)) {
LAB_0020afc2:
          iVar22 = -100;
          goto LAB_0020afc5;
        }
        _w_00 = iVar22 + 1;
        Mat::create(&local_118,_w_00,iVar13 + 1,(this->super_Convolution).num_output,_elemsize,
                    opt->workspace_allocator);
        if (((Allocator *)local_118.data == (Allocator *)0x0) ||
           ((long)local_118.c * local_118.cstep == 0)) goto LAB_0020afc2;
        uVar30 = uVar30 & 0xffffffff;
        if (_w_01 < 1) {
          uVar30 = 0;
        }
        uVar20 = uVar20 & 0xffffffff;
        if (iVar25 < 1) {
          uVar20 = 0;
        }
        uVar7 = bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar7 = 0;
        }
        pAVar19 = (Allocator *)local_c8.data;
        for (uVar23 = 0; uVar23 != uVar7; uVar23 = uVar23 + 1) {
          sVar8 = bottom_blob->cstep;
          pvVar9 = bottom_blob->data;
          sVar10 = bottom_blob->elemsize;
          iVar25 = 0;
          pAVar26 = pAVar19;
          for (uVar27 = 0; uVar27 != uVar20; uVar27 = uVar27 + 1) {
            puVar24 = (undefined4 *)
                      ((long)pvVar9 + (long)iVar25 * 4 + sVar8 * sVar10 * uVar23 + local_160);
            for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
              *(undefined4 *)((long)&pAVar26->_vptr_Allocator + uVar15 * 4) = *puVar24;
              puVar24 = puVar24 + (int)uVar6;
            }
            pAVar26 = (Allocator *)((long)&pAVar26->_vptr_Allocator + (long)_w_01 * 4);
            iVar25 = iVar25 + uVar6 * iVar2;
          }
          pAVar19 = (Allocator *)
                    ((long)&pAVar19->_vptr_Allocator + local_c8.cstep * local_c8.elemsize);
        }
        auVar1[0] = opt->lightmode;
        auVar1[1] = opt->use_shader_pack8;
        auVar1[2] = opt->use_subgroup_ops;
        auVar1[3] = opt->use_reserved_0;
        auVar1._4_4_ = opt->num_threads;
        auVar1._8_8_ = opt->blob_allocator;
        auVar1._16_8_ = opt->workspace_allocator;
        auVar1._24_4_ = opt->openmp_blocktime;
        auVar1[0x1c] = opt->use_winograd_convolution;
        auVar1[0x1d] = opt->use_sgemm_convolution;
        auVar1[0x1e] = opt->use_int8_inference;
        auVar1[0x1f] = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.vulkan_device_index = opt->vulkan_device_index;
        opt_g.use_reserved_1 = opt->use_reserved_1;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_reserved_2 = opt->use_reserved_2;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_shader_local_memory = opt->use_shader_local_memory;
        opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_g.use_fp16_uniform = opt->use_fp16_uniform;
        opt_g.use_int8_uniform = opt->use_int8_uniform;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g._0_8_ = auVar1._0_8_;
        opt_g.blob_allocator = local_118.allocator;
        opt_g.workspace_allocator = (Allocator *)auVar1._16_8_;
        opt_g.openmp_blocktime = auVar1._24_4_;
        opt_g.use_winograd_convolution = (bool)auVar1[0x1c];
        opt_g.use_sgemm_convolution = (bool)auVar1[0x1d];
        opt_g.use_int8_inference = (bool)auVar1[0x1e];
        opt_g.use_vulkan_compute = (bool)auVar1[0x1f];
        (*this->convolution_dilation1->_vptr_Layer[7])
                  (this->convolution_dilation1,&local_c8,&local_118,&opt_g);
        uVar7 = (this->super_Convolution).num_output;
        sVar8 = top_blob->cstep;
        uVar30 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar30 = 0;
        }
        puVar24 = (undefined4 *)((long)top_blob->data + local_180);
        sVar10 = top_blob->elemsize;
        for (uVar20 = 0; uVar20 != uVar30; uVar20 = uVar20 + 1) {
          pAVar19 = (Allocator *)
                    ((long)(_func_int ***)local_118.data +
                    local_118.cstep * local_118.elemsize * uVar20);
          puVar28 = puVar24;
          for (lVar21 = 0; lVar21 <= iVar13; lVar21 = lVar21 + 1) {
            puVar31 = puVar28;
            for (lVar29 = 0; lVar29 <= iVar22; lVar29 = lVar29 + 1) {
              *puVar31 = *(undefined4 *)((long)&pAVar19->_vptr_Allocator + lVar29 * 4);
              puVar31 = puVar31 + (int)uVar6;
            }
            pAVar19 = (Allocator *)((long)&pAVar19->_vptr_Allocator + (long)_w_00 * 4);
            puVar28 = puVar28 + (int)(_w * uVar6);
          }
          puVar24 = (undefined4 *)((long)puVar24 + sVar8 * sVar10);
        }
        local_160 = local_160 + 4;
        local_180 = local_180 + 4;
      }
      local_1c8 = local_1c8 + (long)iVar2 * 4;
      local_1c0 = local_1c0 + (long)iVar12 * 4 + 4;
    }
    pLVar11 = this->activation;
    iVar22 = 0;
    if (pLVar11 != (Layer *)0x0) {
      (*pLVar11->_vptr_Layer[9])(pLVar11,top_blob,opt);
      iVar22 = 0;
    }
LAB_0020afc5:
    piVar14 = (int *)CONCAT44(local_118.refcount._4_4_,(int)local_118.refcount);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar14 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar22;
}

Assistant:

int Convolution_x86_avx::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}